

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O0

void EthBasePort::PrintStatus(ostream *debugStream,uint32_t status)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  ostream *poVar4;
  void *pvVar5;
  uint local_20;
  uint8_t linkSpeed;
  uint8_t portStatus;
  uint port;
  int waitInfo;
  uint ver;
  uint32_t status_local;
  ostream *debugStream_local;
  
  uVar3 = BoardIO::GetFpgaVersionMajorFromStatus(status);
  std::operator<<(debugStream,"Status: ");
  if (uVar3 == 0) {
    poVar4 = std::operator<<(debugStream,"Unknown FPGA, status = ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
    pvVar5 = (void *)std::ostream::operator<<(pvVar5,status);
    pvVar5 = (void *)std::ostream::operator<<(pvVar5,std::dec);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  else if (uVar3 == 1) {
    poVar4 = std::operator<<(debugStream,"No Ethernet present");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    if (uVar3 == 2) {
      if ((status & 0x40000000) != 0) {
        std::operator<<(debugStream,"error ");
      }
      if ((status & 0x20000000) != 0) {
        std::operator<<(debugStream,"initOK ");
      }
    }
    if ((status & 0x10000000) != 0) {
      std::operator<<(debugStream,"FrameErr ");
    }
    if ((status & 0x8000000) != 0) {
      std::operator<<(debugStream,"IPv4Err ");
    }
    if ((status & 0x4000000) != 0) {
      std::operator<<(debugStream,"UDPErr ");
    }
    if ((status & 0x2000000) != 0) {
      std::operator<<(debugStream,"DestErr ");
    }
    if ((status & 0x1000000) != 0) {
      std::operator<<(debugStream,"AccessErr ");
    }
    if ((uVar3 == 2) && ((status & 0x800000) != 0)) {
      std::operator<<(debugStream,"StateErr ");
    }
    if ((uVar3 == 3) && ((status & 0x800000) != 0)) {
      std::operator<<(debugStream,"Clk125 ");
    }
    if ((status & 0x400000) != 0) {
      std::operator<<(debugStream,"EthStateErr ");
    }
    if ((uVar3 == 3) && ((status & 0x200000) != 0)) {
      std::operator<<(debugStream,"Clk200 ");
    }
    if ((status & 0x100000) != 0) {
      std::operator<<(debugStream,"UDP ");
    }
    if (uVar3 == 2) {
      if ((status & 0x80000) == 0) {
        std::operator<<(debugStream,"Link-Off ");
      }
      else {
        std::operator<<(debugStream,"Link-On ");
      }
      if ((status & 0x40000) != 0) {
        std::operator<<(debugStream,"ETH-idle ");
      }
      uVar3 = (status & 0x30000) >> 0x10;
      if (uVar3 == 0) {
        std::operator<<(debugStream,"wait-none");
      }
      else if (uVar3 == 1) {
        std::operator<<(debugStream,"wait-recv");
      }
      else if (uVar3 == 2) {
        std::operator<<(debugStream,"wait-send");
      }
      else {
        std::operator<<(debugStream,"wait-flush");
      }
      std::ostream::operator<<(debugStream,std::endl<char,std::char_traits<char>>);
    }
    else {
      if ((status & 0x10000) != 0) {
        std::operator<<(debugStream,"PS-Eth ");
      }
      std::ostream::operator<<(debugStream,std::endl<char,std::char_traits<char>>);
      for (local_20 = 1; local_20 < 3; local_20 = local_20 + 1) {
        poVar4 = std::operator<<(debugStream,"Port ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_20);
        std::operator<<(poVar4,": ");
        bVar1 = FpgaIO::GetEthernetPortStatusV3(status,local_20);
        if ((bVar1 & 0x80) != 0) {
          std::operator<<(debugStream,"initOK ");
        }
        if ((bVar1 & 0x40) != 0) {
          std::operator<<(debugStream,"hasIRQ ");
        }
        if ((bVar1 & 0x20) == 0) {
          std::operator<<(debugStream,"Link-Off ");
        }
        else {
          std::operator<<(debugStream,"Link-On ");
        }
        cVar2 = (char)((int)(bVar1 & 0x18) >> 3);
        if (cVar2 == '\0') {
          std::operator<<(debugStream,"10 Mbps ");
        }
        else if (cVar2 == '\x01') {
          std::operator<<(debugStream,"100 Mbps ");
        }
        else if (cVar2 == '\x02') {
          std::operator<<(debugStream,"1000 Mbps ");
        }
        if ((bVar1 & 4) != 0) {
          std::operator<<(debugStream,"RecvErr ");
        }
        if ((bVar1 & 2) != 0) {
          std::operator<<(debugStream,"SendOvf ");
        }
        if ((bVar1 & 1) != 0) {
          std::operator<<(debugStream,"PS-Eth ");
        }
        std::ostream::operator<<(debugStream,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  return;
}

Assistant:

void EthBasePort::PrintStatus(std::ostream &debugStream, uint32_t status)
{
    unsigned int ver = BoardIO::GetFpgaVersionMajorFromStatus(status);
    debugStream << "Status: ";
    if (ver == 0) {
        debugStream << "Unknown FPGA, status = " << std::hex << status << std::dec << std::endl;
    }
    else if (ver == 1) {
        // FPGA V1
        debugStream << "No Ethernet present" << std::endl;
    }
    else {
        // FPGA V2 or V3
        if (ver == 2) {
            if (status&FpgaIO::ETH_STAT_REQ_ERR_V2) debugStream << "error ";
            if (status&FpgaIO::ETH_STAT_INIT_OK_V2) debugStream << "initOK ";
        }
        if (status & FpgaIO::ETH_STAT_FRAME_ERR)    debugStream << "FrameErr ";
        if (status & FpgaIO::ETH_STAT_IPV4_ERR)     debugStream << "IPv4Err ";
        if (status & FpgaIO::ETH_STAT_UDP_ERR)      debugStream << "UDPErr ";
        if (status & FpgaIO::ETH_STAT_DEST_ERR)     debugStream << "DestErr ";
        if (status & FpgaIO::ETH_STAT_ACCESS_ERR)   debugStream << "AccessErr ";
        if ((ver == 2) && (status & FpgaIO::ETH_STAT_STATE_ERR_V2)) debugStream << "StateErr ";
        if ((ver == 3) && (status & FpgaIO::ETH_STAT_CLK125_OK_V3)) debugStream << "Clk125 ";
        if (status & FpgaIO::ETH_STAT_ETHST_ERR )   debugStream << "EthStateErr ";
        if ((ver == 3) && (status & FpgaIO::ETH_STAT_CLK200_OK_V3)) debugStream << "Clk200 ";
        if (status & FpgaIO::ETH_STAT_UDP)          debugStream << "UDP ";
        if (ver == 2) {
            if (status & FpgaIO::ETH_STAT_LINK_STAT_V2) debugStream << "Link-On ";
            else                                        debugStream << "Link-Off ";
            if (status & FpgaIO::ETH_STAT_IDLE_V2)  debugStream << "ETH-idle ";
            int waitInfo = (status & FpgaIO::ETH_STAT_WAIT_MASK_V2)>>16;
            if (waitInfo == 0) debugStream << "wait-none";
            else if (waitInfo == 1) debugStream << "wait-recv";
            else if (waitInfo == 2) debugStream << "wait-send";
            else debugStream << "wait-flush";
            debugStream << std::endl;
        }
        else {   // ver == 3
            // Following bit introduced in Firmware Rev 9, but was previously 0
            if (status & FpgaIO::ETH_STAT_PSETH_EN_V3) debugStream << "PS-Eth ";
            debugStream << std::endl;
            for (unsigned int port = 1; port <= 2; port++) {
                debugStream << "Port " << port << ": ";
                uint8_t portStatus = FpgaIO::GetEthernetPortStatusV3(status, port);
                if (portStatus & FpgaIO::ETH_PORT_STAT_INIT_OK)   debugStream << "initOK ";
                if (portStatus & FpgaIO::ETH_PORT_STAT_HAS_IRQ)   debugStream << "hasIRQ ";
                if (portStatus & FpgaIO::ETH_PORT_STAT_LINK_STAT) debugStream << "Link-On ";
                else                                              debugStream << "Link-Off ";
                uint8_t linkSpeed = (portStatus & FpgaIO::ETH_PORT_STAT_SPEED_MASK)>>3;
                if (linkSpeed == 0)                               debugStream << "10 Mbps ";
                else if (linkSpeed == 1)                          debugStream << "100 Mbps ";
                else if (linkSpeed == 2)                          debugStream << "1000 Mbps ";
                // Following are only for Firmware Rev 8
                if (portStatus & FpgaIO::ETH_PORT_STAT_RECV_ERR)  debugStream << "RecvErr ";
                if (portStatus & FpgaIO::ETH_PORT_STAT_SEND_OVF)  debugStream << "SendOvf ";
                if (portStatus & FpgaIO::ETH_PORT_STAT_PS_ETH)    debugStream << "PS-Eth ";
                debugStream << std::endl;
            }
        }
    }
}